

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O0

void __thiscall
HighsLinearSumBounds::add(HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  double dVar1;
  double *pdVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_RDI;
  double in_XMM0_Qa;
  double vUpper;
  double vLower;
  double in_stack_ffffffffffffff88;
  HighsCDouble *in_stack_ffffffffffffff90;
  double local_40;
  double local_38;
  
  if (*(int *)((long)&(in_RDI[9].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_finish)->hi + (long)in_EDX * 4) == in_ESI)
  {
    local_38 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_start)->hi)[in_EDX];
  }
  else {
    pdVar2 = std::max<double>(&(in_RDI[8].
                                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage)->hi + in_EDX,
                              &(in_RDI[8].
                                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                _M_impl.super__Vector_impl_data._M_start)->hi + in_EDX);
    local_38 = *pdVar2;
  }
  if (*(int *)((long)&(in_RDI[9].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->hi + (long)in_EDX * 4) ==
      in_ESI) {
    local_40 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                  super__Vector_impl_data._M_finish)->hi)[in_EDX];
  }
  else {
    pdVar2 = std::min<double>(&(in_RDI[9].
                                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                _M_impl.super__Vector_impl_data._M_start)->hi + in_EDX,
                              &(in_RDI[8].
                                super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                                _M_impl.super__Vector_impl_data._M_finish)->hi + in_EDX);
    local_40 = *pdVar2;
  }
  if (in_XMM0_Qa <= 0.0) {
    if ((local_40 != INFINITY) || (NAN(local_40))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 4,(long)in_ESI);
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)in_ESI);
      *pvVar3 = *pvVar3 + 1;
    }
    if ((local_38 != -INFINITY) || (NAN(local_38))) {
      in_stack_ffffffffffffff90 = (HighsCDouble *)(local_38 * in_XMM0_Qa);
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 5,(long)in_ESI);
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)in_ESI);
      *pvVar3 = *pvVar3 + 1;
    }
    dVar1 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_finish)->hi)[in_EDX];
    if ((dVar1 != INFINITY) || (NAN(dVar1))) {
      in_stack_ffffffffffffff88 =
           (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
              super__Vector_impl_data._M_finish)->hi)[in_EDX] * in_XMM0_Qa;
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI,(long)in_ESI);
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)in_ESI);
      *pvVar3 = *pvVar3 + 1;
    }
    dVar1 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_start)->hi)[in_EDX];
    if ((dVar1 != -INFINITY) || (NAN(dVar1))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 1,(long)in_ESI);
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)in_ESI);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  else {
    if ((local_38 != -INFINITY) || (NAN(local_38))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 4,(long)in_ESI);
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)in_ESI);
      *pvVar3 = *pvVar3 + 1;
    }
    if ((local_40 != INFINITY) || (NAN(local_40))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 5,(long)in_ESI);
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)in_ESI);
      *pvVar3 = *pvVar3 + 1;
    }
    dVar1 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_start)->hi)[in_EDX];
    if ((dVar1 != -INFINITY) || (NAN(dVar1))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI,(long)in_ESI);
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)in_ESI);
      *pvVar3 = *pvVar3 + 1;
    }
    dVar1 = (&(in_RDI[8].super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_finish)->hi)[in_EDX];
    if ((dVar1 != INFINITY) || (NAN(dVar1))) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](in_RDI + 1,(long)in_ESI);
      HighsCDouble::operator+=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)in_ESI);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  return;
}

Assistant:

void HighsLinearSumBounds::add(HighsInt sum, HighsInt var, double coefficient) {
  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);
  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    // coefficient is positive, therefore variable lower contributes to sum
    // lower bound
    if (vLower == -kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vLower * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vUpper * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varLower[var] * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varUpper[var] * coefficient;
  } else {
    // coefficient is negative, therefore variable upper contributes to sum
    // lower bound
    if (vUpper == kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vUpper * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vLower * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varUpper[var] * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varLower[var] * coefficient;
  }
}